

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

void Cnf_ComputeClauses(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                       Vec_Int_t *vMap,Vec_Int_t *vCover,Vec_Int_t *vClauses)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  uint local_c4;
  word local_60;
  word Truth;
  uint local_50;
  int RetValue;
  int OutLit;
  int Cube;
  int k;
  int c;
  Aig_Obj_t *pLeaf;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vMap_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *p_local;
  
  pLeaf = (Aig_Obj_t *)vCover;
  vCover_local = vMap;
  vMap_local = (Vec_Int_t *)vNodes;
  vNodes_local = vLeaves;
  vLeaves_local = (Vec_Ptr_t *)pRoot;
  pRoot_local = (Aig_Obj_t *)p;
  if ((*(ulong *)&pRoot->field_0x18 >> 4 & 1) == 0) {
    __assert_fail("pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xcc,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Vec_IntClear(vClauses);
  local_50 = Cnf_ObjGetLit(vCover_local,(Aig_Obj_t *)vLeaves_local,0);
  Cnf_CollectLeaves((Aig_Obj_t *)vLeaves_local,vNodes_local,0);
  Cnf_CollectVolume((Aig_Man_t *)pRoot_local,(Aig_Obj_t *)vLeaves_local,vNodes_local,
                    (Vec_Ptr_t *)vMap_local);
  pVVar2 = vLeaves_local;
  pVVar5 = (Vec_Ptr_t *)Vec_PtrEntryLast((Vec_Ptr_t *)vMap_local);
  if (pVVar2 != pVVar5) {
    __assert_fail("pRoot == Vec_PtrEntryLast(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xd4,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  for (OutLit = 0; iVar4 = OutLit, iVar3 = Vec_PtrSize((Vec_Ptr_t *)vMap_local), iVar4 < iVar3;
      OutLit = OutLit + 1) {
    _k = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vMap_local,OutLit);
    iVar4 = Aig_ObjFaninC0(_k);
    if (((iVar4 != 0) && (pAVar6 = Aig_ObjFanin0(_k), (*(ulong *)&pAVar6->field_0x18 >> 4 & 1) == 0)
        ) || ((iVar4 = Aig_ObjFaninC1(_k), iVar4 != 0 &&
              (pAVar6 = Aig_ObjFanin1(_k), (*(ulong *)&pAVar6->field_0x18 >> 4 & 1) == 0)))) break;
  }
  iVar4 = OutLit;
  iVar3 = Vec_PtrSize((Vec_Ptr_t *)vMap_local);
  if (iVar4 == iVar3) {
    Cnf_CollectLeaves((Aig_Obj_t *)vLeaves_local,vNodes_local,1);
    Vec_IntPush(vClauses,0);
    Vec_IntPush(vClauses,local_50);
    for (OutLit = 0; iVar4 = OutLit, iVar3 = Vec_PtrSize(vNodes_local), iVar4 < iVar3;
        OutLit = OutLit + 1) {
      _k = (Aig_Obj_t *)Vec_PtrEntry(vNodes_local,OutLit);
      pVVar1 = vCover_local;
      pAVar6 = Aig_Regular(_k);
      iVar4 = Aig_IsComplement(_k);
      iVar4 = Cnf_ObjGetLit(pVVar1,pAVar6,(uint)((iVar4 != 0 ^ 0xffU) & 1));
      Vec_IntPush(vClauses,iVar4);
    }
    for (OutLit = 0; iVar4 = OutLit, iVar3 = Vec_PtrSize(vNodes_local), iVar4 < iVar3;
        OutLit = OutLit + 1) {
      _k = (Aig_Obj_t *)Vec_PtrEntry(vNodes_local,OutLit);
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,local_50 ^ 1);
      pVVar1 = vCover_local;
      pAVar6 = Aig_Regular(_k);
      iVar4 = Aig_IsComplement(_k);
      iVar4 = Cnf_ObjGetLit(pVVar1,pAVar6,iVar4);
      Vec_IntPush(vClauses,iVar4);
    }
  }
  else {
    iVar4 = Vec_PtrSize(vNodes_local);
    if (6 < iVar4) {
      printf("FastCnfGeneration:  Internal error!!!\n");
    }
    iVar4 = Vec_PtrSize(vNodes_local);
    if (6 < iVar4) {
      __assert_fail("Vec_PtrSize(vLeaves) <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                    ,0xf0,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    local_60 = Cnf_CutDeriveTruth((Aig_Man_t *)pRoot_local,vNodes_local,(Vec_Ptr_t *)vMap_local);
    if ((local_60 == 0) || (local_60 == 0xffffffffffffffff)) {
      Vec_IntPush(vClauses,0);
      if (local_60 == 0) {
        local_c4 = local_50 ^ 1;
      }
      else {
        local_c4 = local_50;
      }
      Vec_IntPush(vClauses,local_c4);
    }
    else {
      iVar4 = Vec_PtrSize(vNodes_local);
      Truth._4_4_ = Kit_TruthIsop((uint *)&local_60,iVar4,(Vec_Int_t *)pLeaf,0);
      if (Truth._4_4_ < 0) {
        __assert_fail("RetValue >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0xfb,
                      "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      for (Cube = 0; iVar4 = Cube, iVar3 = Vec_IntSize((Vec_Int_t *)pLeaf), iVar4 < iVar3;
          Cube = Cube + 1) {
        RetValue = Vec_IntEntry((Vec_Int_t *)pLeaf,Cube);
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,local_50);
        for (OutLit = 0; iVar4 = OutLit, iVar3 = Vec_PtrSize(vNodes_local), pVVar1 = vCover_local,
            iVar4 < iVar3; OutLit = OutLit + 1) {
          if ((RetValue & 3U) != 0) {
            if ((RetValue & 3U) == 3) {
              __assert_fail("(Cube & 3) != 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                            ,0x105,
                            "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vNodes_local,OutLit);
            iVar4 = Cnf_ObjGetLit(pVVar1,pAVar6,(uint)((RetValue & 3U) != 1));
            Vec_IntPush(vClauses,iVar4);
          }
          RetValue = RetValue >> 2;
        }
      }
      local_60 = local_60 ^ 0xffffffffffffffff;
      iVar4 = Vec_PtrSize(vNodes_local);
      Truth._4_4_ = Kit_TruthIsop((uint *)&local_60,iVar4,(Vec_Int_t *)pLeaf,0);
      if (Truth._4_4_ < 0) {
        __assert_fail("RetValue >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0x10d,
                      "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      for (Cube = 0; iVar4 = Cube, iVar3 = Vec_IntSize((Vec_Int_t *)pLeaf), iVar4 < iVar3;
          Cube = Cube + 1) {
        RetValue = Vec_IntEntry((Vec_Int_t *)pLeaf,Cube);
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,local_50 ^ 1);
        for (OutLit = 0; iVar4 = OutLit, iVar3 = Vec_PtrSize(vNodes_local), pVVar1 = vCover_local,
            iVar4 < iVar3; OutLit = OutLit + 1) {
          if ((RetValue & 3U) != 0) {
            if ((RetValue & 3U) == 3) {
              __assert_fail("(Cube & 3) != 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                            ,0x116,
                            "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vNodes_local,OutLit);
            iVar4 = Cnf_ObjGetLit(pVVar1,pAVar6,(uint)((RetValue & 3U) != 1));
            Vec_IntPush(vClauses,iVar4);
          }
          RetValue = RetValue >> 2;
        }
      }
    }
  }
  return;
}

Assistant:

void Cnf_ComputeClauses( Aig_Man_t * p, Aig_Obj_t * pRoot, 
    Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vMap, Vec_Int_t * vCover, Vec_Int_t * vClauses )
{
    Aig_Obj_t * pLeaf;
    int c, k, Cube, OutLit, RetValue;
    word Truth;
    assert( pRoot->fMarkA );

    Vec_IntClear( vClauses );

    OutLit = Cnf_ObjGetLit( vMap, pRoot, 0 );
    // detect cone
    Cnf_CollectLeaves( pRoot, vLeaves, 0 );
    Cnf_CollectVolume( p, pRoot, vLeaves, vNodes );
    assert( pRoot == Vec_PtrEntryLast(vNodes) );
    // check if this is an AND-gate
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pLeaf, k )
    {
        if ( Aig_ObjFaninC0(pLeaf) && !Aig_ObjFanin0(pLeaf)->fMarkA )
            break;
        if ( Aig_ObjFaninC1(pLeaf) && !Aig_ObjFanin1(pLeaf)->fMarkA )
            break;
    }
    if ( k == Vec_PtrSize(vNodes) )
    {
        Cnf_CollectLeaves( pRoot, vLeaves, 1 );
        // write big clause
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), !Aig_IsComplement(pLeaf)) );
        // write small clauses
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
        {
            Vec_IntPush( vClauses, 0 );
            Vec_IntPush( vClauses, OutLit ^ 1 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), Aig_IsComplement(pLeaf)) );
        }
        return;
    }
    if ( Vec_PtrSize(vLeaves) > 6 )
        printf( "FastCnfGeneration:  Internal error!!!\n" );
    assert( Vec_PtrSize(vLeaves) <= 6 );

    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );
    if ( Truth == 0 || Truth == ~(word)0 )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, (Truth == 0) ? (OutLit ^ 1) : OutLit );
        return;
    }

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );

    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit ^ 1 );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }
}